

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::MultipartFormDataParser::MultipartFormDataParser(MultipartFormDataParser *this)

{
  allocator local_25 [20];
  allocator local_11;
  MultipartFormDataParser *local_10;
  MultipartFormDataParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"--",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->crlf_,"\r\n",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::__cxx11::string::string((string *)&this->boundary_);
  std::__cxx11::string::string((string *)&this->buf_);
  this->state_ = 0;
  this->is_valid_ = 0;
  this->is_done_ = 0;
  this->off_ = 0;
  MultipartFormData::MultipartFormData(&this->file_);
  return;
}

Assistant:

MultipartFormDataParser() {}